

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::transformed_draw_extra
          (Fl_PostScript_Graphics_Driver *this,char *str,int n,double x,double y,int w,bool rtl)

{
  bool bVar1;
  uchar *puVar2;
  Fl_Graphics_Driver *pFVar3;
  char *pcVar4;
  int iVar5;
  Fl_Color FVar6;
  int iVar7;
  Fl_Display_Device *pFVar8;
  void *data;
  ulong uVar9;
  byte *pbVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  undefined7 in_register_00000081;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  byte bVar18;
  uint uVar19;
  uchar *puVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float fVar21;
  uchar green;
  uchar red;
  uchar local_ab;
  uchar local_aa;
  uchar local_a9;
  ulong local_a8;
  byte *local_a0;
  ulong local_98;
  uchar *local_90;
  Fl_Color local_84;
  undefined4 local_80;
  int local_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  Fl_Surface_Device *local_68;
  Window local_60;
  Window local_58;
  char *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_80 = (undefined4)CONCAT71(in_register_00000081,rtl);
  local_90 = (uchar *)CONCAT44(local_90._4_4_,n);
  local_a8 = CONCAT44(local_a8._4_4_,(this->super_Fl_Graphics_Driver).size_);
  local_a0 = (byte *)CONCAT44(local_a0._4_4_,(this->super_Fl_Graphics_Driver).font_);
  local_7c = w;
  local_50 = str;
  local_40 = x;
  local_38 = y;
  iVar5 = (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x3a])();
  _local_78 = ZEXT416((uint)(float)iVar5);
  local_98 = CONCAT44(local_98._4_4_,(int)(float)iVar5);
  uVar19 = (this->super_Fl_Graphics_Driver).color_;
  FVar6 = fl_contrast(0xff,uVar19);
  iVar5 = (int)(float)local_78._0_4_;
  local_78._4_4_ = (float)(int)(float)local_78._4_4_;
  local_78._0_4_ = (float)iVar5;
  fStack_70 = (float)(int)fStack_70;
  fStack_6c = (float)(int)fStack_6c;
  uVar15 = (uint)((float)iVar5 + 3.0);
  local_58 = XCreatePixmap(fl_display,
                           *(undefined8 *)
                            (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                           (int)((double)w * 1.5),uVar15,fl_visual->depth);
  local_60 = fl_window;
  local_68 = Fl_Surface_Device::_surface;
  fl_window = local_58;
  if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
    local_68 = Fl_Surface_Device::default_surface();
  }
  pFVar8 = Fl_Display_Device::display_device();
  (*(pFVar8->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar8);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
  local_84 = FVar6;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar6);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,0,0,(ulong)(uint)(int)((double)w * 1.5),(ulong)uVar15);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)uVar19);
  pbVar10 = local_a0;
  pFVar3 = fl_graphics_driver;
  fl_graphics_driver->font_descriptor_ = (Fl_Font_Descriptor *)0x0;
  (*(pFVar3->super_Fl_Device)._vptr_Fl_Device[0x36])(pFVar3,(ulong)local_a0 & 0xffffffff,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)pbVar10 & 0xffffffff,(ulong)(uint)(int)(float)(int)local_a8);
  pcVar4 = local_50;
  puVar20 = local_90;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
            (fl_graphics_driver,local_50,(ulong)local_90 & 0xffffffff);
  uVar19 = (uint)(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  iVar5 = (int)local_98;
  local_48 = (double)(int)local_98;
  uVar9 = 1;
  if ((byte)local_80 != 0) {
    uVar9 = (ulong)uVar19;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[(ulong)(byte)local_80 * 2 + 0xe])
            (fl_graphics_driver,pcVar4,(ulong)puVar20 & 0xffffffff,uVar9,
             (ulong)(uint)(int)(local_48 * 0.8));
  local_90 = fl_read_image((uchar *)0x0,1,1,uVar19,iVar5,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = local_60;
  (*(local_68->super_Fl_Device)._vptr_Fl_Device[3])();
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
            (this,(ulong)local_a0 & 0xffffffff,local_a8 & 0xffffffff);
  XFreePixmap(fl_display,local_58);
  Fl::get_color(local_84,&local_a9,&local_aa,&local_ab);
  iVar16 = uVar19 + 0xe;
  if (-1 < (int)(uVar19 + 7)) {
    iVar16 = uVar19 + 7;
  }
  iVar16 = iVar16 >> 3;
  local_a8 = (ulong)uVar19;
  local_a0 = (byte *)operator_new__((long)(iVar16 * iVar5));
  if (0 < iVar5) {
    iVar7 = (int)local_a8;
    pbVar10 = local_a0;
    puVar20 = local_90;
    iVar5 = (int)local_98;
    do {
      if (0 < iVar7) {
        iVar12 = 0;
        iVar13 = -iVar7;
        do {
          bVar11 = 0x80;
          iVar14 = 0;
          bVar18 = 0;
          puVar2 = puVar20;
          while( true ) {
            puVar20 = puVar2 + 3;
            if (((*puVar2 != local_a9) || (puVar2[1] != local_aa)) || (puVar2[2] != local_ab)) {
              bVar18 = bVar18 | bVar11;
            }
            if (iVar14 == -7) break;
            bVar11 = bVar11 >> 1;
            iVar14 = iVar14 + -1;
            puVar2 = puVar20;
            if (iVar13 == iVar14) {
              *pbVar10 = bVar18;
              pbVar10 = pbVar10 + 1;
              goto LAB_00203f04;
            }
          }
          *pbVar10 = bVar18;
          pbVar10 = pbVar10 + 1;
          iVar12 = iVar12 + 8;
          iVar13 = iVar13 + 8;
        } while (iVar12 != iVar7);
      }
LAB_00203f04:
      bVar1 = 1 < iVar5;
      iVar5 = iVar5 + -1;
    } while (bVar1);
  }
  if (local_90 != (uchar *)0x0) {
    operator_delete__(local_90);
  }
  uVar9 = local_98;
  fVar21 = (float)(int)local_a8 / (float)local_7c;
  iVar5 = (int)local_98;
  clocale_printf(this,"%g %g %g %g %d %d MI\n",SUB84(local_40,0),
                 SUB84(local_38 + (local_48 * -0.77) / (double)fVar21,0),
                 (double)((float)(int)local_a8 / fVar21),(double)((float)local_78._0_4_ / fVar21),
                 local_a8,local_98 & 0xffffffff);
  data = prepare_rle85(this);
  if (0 < iVar5) {
    iVar5 = 1;
    if (1 < iVar16) {
      iVar5 = iVar16;
    }
    pbVar10 = local_a0 + ((uVar9 & 0xffffffff) - 1) * (long)iVar16;
    local_98 = -(long)iVar16;
    uVar9 = uVar9 & 0xffffffff;
    do {
      if (0 < (int)local_a8) {
        lVar17 = 0;
        do {
          write_rle85(this,pbVar10[lVar17],data);
          lVar17 = lVar17 + 1;
        } while (iVar5 != (int)lVar17);
      }
      pbVar10 = pbVar10 + local_98;
      bVar1 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar1);
  }
  close_rle85(this,data);
  fputc(10,(FILE *)this->output);
  operator_delete__(local_a0);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::transformed_draw_extra(const char* str, int n, double x, double y, int w, bool rtl)
{
  // scale for bitmask computation
#if defined(USE_X11) && !USE_XFT
  float scale = 1; // don't scale because we can't expect to have scalable fonts
#else
  float scale = 2;
#endif
  Fl_Fontsize old_size = size();
  Fl_Font fontnum = Fl_Graphics_Driver::font();
  int w_scaled =  (int)(w * (scale + 0.5));
  int h = (int)(height() * scale);
  // create an offscreen image of the string
  Fl_Color text_color = Fl_Graphics_Driver::color();
  Fl_Color bg_color = fl_contrast(FL_WHITE, text_color);
  Fl_Offscreen off = fl_create_offscreen(w_scaled, (int)(h+3*scale) );
  fl_begin_offscreen(off);
  fl_color(bg_color);
  // color offscreen background with a shade contrasting with the text color
  fl_rectf(0, 0, w_scaled, (int)(h+3*scale) );
  fl_color(text_color);
#if defined(USE_X11) && !USE_XFT
  // force seeing this font as new so it's applied to the offscreen graphics context
  fl_graphics_driver->font_descriptor(NULL);
  fl_font(fontnum, 0);
#endif
  fl_font(fontnum, (Fl_Fontsize)(scale * old_size) );
  int w2 = (int)fl_width(str, n);
  // draw string in offscreen
  if (rtl) fl_rtl_draw(str, n, w2, (int)(h * 0.8) );
  else fl_draw(str, n, 1, (int)(h * 0.8) );
  // read (most of) the offscreen image
  uchar *img = fl_read_image(NULL, 1, 1, w2, h, 0);
  fl_end_offscreen();
  font(fontnum, old_size);
  fl_delete_offscreen(off);
  // compute the mask of what is not the background
  uchar *mask = calc_mask(img, w2, h, bg_color);
  delete[] img;
  // write the string image to PostScript as a scaled bitmask
  scale = w2 / float(w);
  clocale_printf("%g %g %g %g %d %d MI\n", x, y - h*0.77/scale, w2/scale, h/scale, w2, h);
  uchar *di;
  int wmask = (w2+7)/8;
  void *rle85 = prepare_rle85();
  for (int j = h - 1; j >= 0; j--){
    di = mask + j * wmask;
    for (int i = 0; i < wmask; i++){
      write_rle85(*di, rle85);
      di++;
    }
  }
  close_rle85(rle85); fputc('\n', output);
  delete[] mask;
}